

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenInitializer.cxx
# Opt level: O2

bool __thiscall
cmQtAutoGenInitializer::GetQtExecutable
          (cmQtAutoGenInitializer *this,GenVarsT *genVars,string *executable,
          bool ignoreMissingTarget,string *output)

{
  bool bVar1;
  char *__s;
  cmLocalGenerator *pcVar2;
  cmGeneratorTarget *this_00;
  undefined7 in_register_00000009;
  string *this_01;
  byte bVar3;
  string val;
  string prop;
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_> cge
  ;
  anon_class_16_2_c95d1c49 print_err;
  cmGeneratorExpression ge;
  cmListFileBacktrace lfbt;
  allocator<char> local_105;
  undefined4 local_104;
  string local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  undefined1 local_c0 [8];
  string local_b8;
  anon_class_16_2_c95d1c49 local_98;
  string *local_88;
  undefined1 local_80 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_68;
  __shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2> local_60;
  string local_50;
  
  local_104 = (undefined4)CONCAT71(in_register_00000009,ignoreMissingTarget);
  local_98.this = this;
  local_98.genVars = genVars;
  std::operator+(&local_e0,genVars->GenNameUpper,"_EXECUTABLE");
  __s = cmTarget::GetSafeProperty(this->Target->Target,&local_e0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_100,__s,(allocator<char> *)(local_c0 + 8));
  local_88 = output;
  if (local_100._M_string_length != 0) {
    cmMakefile::GetBacktrace((cmMakefile *)(local_80 + 0x10));
    std::__shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_60,
               (__shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2> *)
               (local_80 + 0x10));
    cmGeneratorExpression::cmGeneratorExpression
              ((cmGeneratorExpression *)local_80,(cmListFileBacktrace *)&local_60);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_60._M_refcount);
    cmGeneratorExpression::Parse((cmGeneratorExpression *)local_c0,(string *)local_80);
    pcVar2 = cmGeneratorTarget::GetLocalGenerator(this->Target);
    std::__cxx11::string::string<std::allocator<char>>((string *)(local_c0 + 8),"",&local_105);
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    local_50._M_string_length = 0;
    local_50.field_2._M_local_buf[0] = '\0';
    cmCompiledGeneratorExpression::Evaluate
              ((cmCompiledGeneratorExpression *)local_c0,pcVar2,(string *)(local_c0 + 8),false,
               (cmGeneratorTarget *)0x0,(cmGeneratorTarget *)0x0,
               (cmGeneratorExpressionDAGChecker *)0x0,&local_50);
    std::__cxx11::string::_M_assign((string *)&genVars->Executable);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)(local_c0 + 8));
    std::
    unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>::
    ~unique_ptr((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                 *)local_c0);
    cmGeneratorExpression::~cmGeneratorExpression((cmGeneratorExpression *)local_80);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_68);
    if ((genVars->Executable)._M_string_length == 0 && (char)local_104 == '\0') {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (local_c0 + 8),&local_e0," evaluates to an empty value");
      GetQtExecutable::anon_class_16_2_c95d1c49::operator()(&local_98,(string *)(local_c0 + 8));
      std::__cxx11::string::~string((string *)(local_c0 + 8));
      output = (string *)0x0;
    }
    else {
      bVar1 = cmsys::SystemTools::FileExists(&genVars->Executable);
      genVars->ExecutableExists = bVar1;
      output = (string *)0x1;
    }
  }
  bVar3 = (byte)output;
  std::__cxx11::string::~string((string *)&local_100);
  std::__cxx11::string::~string((string *)&local_e0);
  if (local_100._M_string_length == 0) {
    local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
    local_e0._M_string_length = 0;
    local_e0.field_2._M_local_buf[0] = '\0';
    if ((this->QtVersion).Major - 4 < 3) {
      std::__cxx11::string::assign((char *)&local_e0);
    }
    std::__cxx11::string::append((string *)&local_e0);
    pcVar2 = cmGeneratorTarget::GetLocalGenerator(this->Target);
    this_00 = cmLocalGenerator::FindGeneratorTargetToUse(pcVar2,&local_e0);
    if (this_00 == (cmGeneratorTarget *)0x0) {
      bVar3 = 1;
      if ((char)local_104 == '\0') {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_100,"Could not find ",(allocator<char> *)(local_c0 + 8));
        std::__cxx11::string::append((string *)&local_100);
        std::__cxx11::string::append((char *)&local_100);
        std::__cxx11::string::append((string *)&local_100);
        GetQtExecutable::anon_class_16_2_c95d1c49::operator()(&local_98,&local_100);
        std::__cxx11::string::~string((string *)&local_100);
        bVar3 = 0;
      }
    }
    else {
      std::__cxx11::string::_M_assign((string *)&genVars->ExecutableTargetName);
      genVars->ExecutableTarget = this_00;
      bVar1 = cmGeneratorTarget::IsImported(this_00);
      if (bVar1) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)(local_c0 + 8),"",(allocator<char> *)&local_50);
        cmGeneratorTarget::ImportedGetLocation(&local_100,this_00,(string *)(local_c0 + 8));
        std::__cxx11::string::operator=((string *)&genVars->Executable,(string *)&local_100);
        std::__cxx11::string::~string((string *)&local_100);
        this_01 = (string *)(local_c0 + 8);
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_100,"",(allocator<char> *)(local_c0 + 8));
        cmGeneratorTarget::GetLocation(this_00,&local_100);
        std::__cxx11::string::assign((char *)&genVars->Executable);
        this_01 = &local_100;
      }
      std::__cxx11::string::~string((string *)this_01);
    }
    std::__cxx11::string::~string((string *)&local_e0);
    if (this_00 != (cmGeneratorTarget *)0x0) {
      local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
      local_e0._M_string_length = 0;
      local_e0.field_2._M_local_buf[0] = '\0';
      bVar1 = cmQtAutoGenGlobalInitializer::GetExecutableTestOutput
                        (this->GlobalInitializer,executable,&genVars->Executable,&local_e0,local_88)
      ;
      if (bVar1) {
        genVars->ExecutableExists = true;
      }
      else {
        GetQtExecutable::anon_class_16_2_c95d1c49::operator()(&local_98,&local_e0);
        bVar3 = 0;
      }
      std::__cxx11::string::~string((string *)&local_e0);
      bVar3 = bVar3 | bVar1;
    }
  }
  return (bool)(bVar3 & 1);
}

Assistant:

bool cmQtAutoGenInitializer::GetQtExecutable(GenVarsT& genVars,
                                             const std::string& executable,
                                             bool ignoreMissingTarget,
                                             std::string* output) const
{
  auto print_err = [this, &genVars](std::string const& err) {
    std::string msg = genVars.GenNameUpper;
    msg += " for target ";
    msg += this->Target->GetName();
    msg += ": ";
    msg += err;
    cmSystemTools::Error(msg);
  };

  // Custom executable
  {
    std::string const prop = genVars.GenNameUpper + "_EXECUTABLE";
    std::string const val = this->Target->Target->GetSafeProperty(prop);
    if (!val.empty()) {
      // Evaluate generator expression
      {
        cmListFileBacktrace lfbt =
          this->Target->Target->GetMakefile()->GetBacktrace();
        cmGeneratorExpression ge(lfbt);
        std::unique_ptr<cmCompiledGeneratorExpression> cge = ge.Parse(val);
        genVars.Executable =
          cge->Evaluate(this->Target->GetLocalGenerator(), "");
      }
      if (genVars.Executable.empty() && !ignoreMissingTarget) {
        print_err(prop + " evaluates to an empty value");
        return false;
      }

      // Check if the provided executable already exists (it's possible for it
      // not to exist when building Qt itself).
      genVars.ExecutableExists = cmSystemTools::FileExists(genVars.Executable);
      return true;
    }
  }

  // Find executable target
  {
    // Find executable target name
    std::string targetName;
    if (this->QtVersion.Major == 4) {
      targetName = "Qt4::";
    } else if (this->QtVersion.Major == 5) {
      targetName = "Qt5::";
    } else if (this->QtVersion.Major == 6) {
      targetName = "Qt6::";
    }
    targetName += executable;

    // Find target
    cmLocalGenerator* localGen = this->Target->GetLocalGenerator();
    cmGeneratorTarget* target = localGen->FindGeneratorTargetToUse(targetName);
    if (target != nullptr) {
      genVars.ExecutableTargetName = targetName;
      genVars.ExecutableTarget = target;
      if (target->IsImported()) {
        genVars.Executable = target->ImportedGetLocation("");
      } else {
        genVars.Executable = target->GetLocation("");
      }
    } else {
      if (ignoreMissingTarget) {
        return true;
      }
      std::string err = "Could not find ";
      err += executable;
      err += " executable target ";
      err += targetName;
      print_err(err);
      return false;
    }
  }

  // Test executable
  {
    std::string err;
    if (!this->GlobalInitializer->GetExecutableTestOutput(
          executable, genVars.Executable, err, output)) {
      print_err(err);
      return false;
    }
    genVars.ExecutableExists = true;
  }

  return true;
}